

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

uint get_elf_hwcap(uint type)

{
  int iVar1;
  anon_struct_8_2_05f151bc in_RAX;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  anon_struct_8_2_05f151bc entry;
  
  entry = in_RAX;
  __stream = fopen("/proc/self/auxv","rb");
  if (__stream == (FILE *)0x0) {
    fwrite("fopen /proc/self/auxv failed",0x1c,1,_stderr);
    fputc(10,_stderr);
    uVar3 = 0;
  }
  else {
    while ((iVar1 = feof(__stream), uVar3 = 0, iVar1 == 0 &&
           (sVar2 = fread(&entry,8,1,__stream), uVar3 = 0, (int)sVar2 == 1))) {
      if ((entry.tag == 0 && entry.value == 0) || (uVar3 = entry.value, entry.tag == type)) break;
    }
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
    unsigned int hwcap = 0;

#if defined __ANDROID__
    hwcap = get_elf_hwcap_from_getauxval(type);
#endif

    if (!hwcap)
        hwcap = get_elf_hwcap_from_proc_self_auxv(type);

#if defined __ANDROID__
#if __aarch64__
    if (type == AT_HWCAP)
    {
        // samsung exynos9810 on android pre-9 incorrectly reports armv8.2
        // for little cores, but big cores only support armv8.0
        // drop all armv8.2 features used by ncnn for preventing SIGILLs
        // ref https://reviews.llvm.org/D114523
        char arch[PROP_VALUE_MAX];
        int len = __system_property_get("ro.arch", arch);
        if (len > 0 && strncmp(arch, "exynos9810", 10) == 0)
        {
            hwcap &= ~HWCAP_ASIMDHP;
            hwcap &= ~HWCAP_ASIMDDP;
        }
    }
#endif // __aarch64__
#endif // defined __ANDROID__

    return hwcap;
}